

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O2

bool chaiscript::optimizer::
     contains_var_decl_in_scope<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node
               )

{
  AST_Node_Type AVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node_00;
  size_t i;
  size_t offset;
  bool bVar5;
  
  uVar3 = (ulong)(node->super_AST_Node).identifier;
  if ((0x22 < uVar3) || (bVar5 = true, (0x400000060U >> (uVar3 & 0x3f) & 1) == 0)) {
    sVar4 = child_count<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(node);
    for (offset = 0; bVar5 = sVar4 != offset, bVar5; offset = offset + 1) {
      node_00 = child_at<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                          (node,offset);
      AVar1 = (node_00->super_AST_Node).identifier;
      if (((Ranged_For < AVar1) || ((0x18400U >> (AVar1 & Attr_Decl) & 1) == 0)) &&
         (bVar2 = contains_var_decl_in_scope<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                            (node_00), bVar2)) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool contains_var_decl_in_scope(const eval::AST_Node_Impl<T> &node) noexcept {
      if (node.identifier == AST_Node_Type::Var_Decl || node.identifier == AST_Node_Type::Assign_Decl
          || node.identifier == AST_Node_Type::Reference) {
        return true;
      }

      const auto num = child_count(node);

      for (size_t i = 0; i < num; ++i) {
        const auto &child = child_at(node, i);
        if (child.identifier != AST_Node_Type::Block && child.identifier != AST_Node_Type::For
            && child.identifier != AST_Node_Type::Ranged_For && contains_var_decl_in_scope(child)) {
          return true;
        }
      }

      return false;
    }